

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::CloseCurrentPopup(void)

{
  ImGuiID IVar1;
  ImGuiWindow *pIVar2;
  bool bVar3;
  ImGuiContext *pIVar4;
  ImGuiPopupData *pIVar5;
  ImGuiWindow *window;
  bool close_parent;
  ImGuiWindow *parent_popup_window;
  ImGuiWindow *popup_window;
  int popup_idx;
  ImGuiContext *g;
  
  pIVar4 = GImGui;
  popup_window._4_4_ = (GImGui->BeginPopupStack).Size + -1;
  if ((-1 < popup_window._4_4_) && (popup_window._4_4_ < (GImGui->OpenPopupStack).Size)) {
    pIVar5 = ImVector<ImGuiPopupData>::operator[](&GImGui->BeginPopupStack,popup_window._4_4_);
    IVar1 = pIVar5->PopupId;
    pIVar5 = ImVector<ImGuiPopupData>::operator[](&pIVar4->OpenPopupStack,popup_window._4_4_);
    if (IVar1 == pIVar5->PopupId) {
      for (; 0 < popup_window._4_4_; popup_window._4_4_ = popup_window._4_4_ + -1) {
        pIVar5 = ImVector<ImGuiPopupData>::operator[](&pIVar4->OpenPopupStack,popup_window._4_4_);
        pIVar2 = pIVar5->Window;
        pIVar5 = ImVector<ImGuiPopupData>::operator[]
                           (&pIVar4->OpenPopupStack,popup_window._4_4_ + -1);
        bVar3 = false;
        if ((((pIVar2 != (ImGuiWindow *)0x0) && ((pIVar2->Flags & 0x10000000U) != 0)) &&
            (pIVar5->Window != (ImGuiWindow *)0x0)) && ((pIVar5->Window->Flags & 0x400U) == 0)) {
          bVar3 = true;
        }
        if (!bVar3) break;
      }
      ClosePopupToLevel(popup_window._4_4_,true);
      if (pIVar4->NavWindow != (ImGuiWindow *)0x0) {
        (pIVar4->NavWindow->DC).NavHideHighlightOneFrame = true;
      }
    }
  }
  return;
}

Assistant:

void ImGui::CloseCurrentPopup()
{
    ImGuiContext& g = *GImGui;
    int popup_idx = g.BeginPopupStack.Size - 1;
    if (popup_idx < 0 || popup_idx >= g.OpenPopupStack.Size || g.BeginPopupStack[popup_idx].PopupId != g.OpenPopupStack[popup_idx].PopupId)
        return;

    // Closing a menu closes its top-most parent popup (unless a modal)
    while (popup_idx > 0)
    {
        ImGuiWindow* popup_window = g.OpenPopupStack[popup_idx].Window;
        ImGuiWindow* parent_popup_window = g.OpenPopupStack[popup_idx - 1].Window;
        bool close_parent = false;
        if (popup_window && (popup_window->Flags & ImGuiWindowFlags_ChildMenu))
            if (parent_popup_window && !(parent_popup_window->Flags & ImGuiWindowFlags_MenuBar))
                close_parent = true;
        if (!close_parent)
            break;
        popup_idx--;
    }
    IMGUI_DEBUG_LOG_POPUP("CloseCurrentPopup %d -> %d\n", g.BeginPopupStack.Size - 1, popup_idx);
    ClosePopupToLevel(popup_idx, true);

    // A common pattern is to close a popup when selecting a menu item/selectable that will open another window.
    // To improve this usage pattern, we avoid nav highlight for a single frame in the parent window.
    // Similarly, we could avoid mouse hover highlight in this window but it is less visually problematic.
    if (ImGuiWindow* window = g.NavWindow)
        window->DC.NavHideHighlightOneFrame = true;
}